

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O2

void __thiscall
HttpdBufferedReader_GetcThenEOF_Test::TestBody(HttpdBufferedReader_GetcThenEOF_Test *this)

{
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *pTVar1;
  char *pcVar2;
  maybe<char,_void> *pmVar3;
  char cVar4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *in_R9;
  allocator local_1c1;
  MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&> local_1c0;
  AssertionResult gtest_ar;
  string local_188;
  getc_result_type c1;
  AssertionResult gtest_ar_;
  extent_type<_1L> local_130;
  _Invoker_type p_Stack_128;
  maybe<char,_void> char1;
  _Function_base local_108;
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
  br;
  refiller r;
  
  refiller::refiller(&r);
  local_188._M_string_length =
       (size_type)
       testing::internal::MatcherBase<int>::
       GetVTable<testing::internal::MatcherBase<int>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_188._M_dataplus._M_p = (pointer)&PTR__MatcherBase_001b11c8;
  local_1c0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::gsl::span<unsigned_char,-1l>const&>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<unsigned_char,-1l>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_1c0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001b1210;
  refiller::gmock_fill
            ((MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)&br,&r,(Matcher<int> *)&local_188,
             (Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&> *)&local_1c0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::InternalExpectedAt
                     ((MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                       *)&br,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                      ,0x3d,"r","fill (_, _)");
  eof();
  c1.field_0.storage_ = (type)0x0;
  c1.field_0._8_8_ = 0;
  c1.has_error_ = false;
  c1._17_7_ = 0;
  if ((_Manager_type)local_130.size_ != (_Manager_type)0x0) {
    c1.field_0._1_7_ = gtest_ar_._1_7_;
    c1.field_0._0_1_ = gtest_ar_.success_;
    c1.field_0._8_8_ =
         gtest_ar_.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    c1._16_8_ = local_130.size_;
    local_130.size_ = 0;
    p_Stack_128 = (_Invoker_type)0x0;
  }
  testing::
  Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::
  Action<std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>,void>
            ((Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)&gtest_ar,
             (function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)&c1);
  testing::internal::
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::WillRepeatedly(pTVar1,(Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                           *)&gtest_ar);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  std::_Function_base::~_Function_base((_Function_base *)&c1);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::
  _Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
                  *)((long)&br.refill_.super__Function_base._M_functor + 8));
  testing::internal::MatcherBase<const_pstore::gsl::span<unsigned_char,_-1L>_&>::~MatcherBase
            (&local_1c0);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_188);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1c0,0);
  _char1 = &PTR__MatcherBase_001b1210;
  refiller::gmock_fill
            ((MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)&br,&r,(Matcher<int> *)&local_1c0,
             (Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&> *)&char1);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::InternalExpectedAt
                     ((MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                       *)&br,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                      ,0x3e,"r","fill (0, _)");
  std::__cxx11::string::string((string *)&local_188,"a",&local_1c1);
  yield_string((refiller_function *)&gtest_ar_,&local_188);
  c1.field_0.storage_ = (type)0x0;
  c1.field_0._8_8_ = 0;
  c1.has_error_ = false;
  c1._17_7_ = 0;
  if ((_Manager_type)local_130.size_ != (_Manager_type)0x0) {
    c1.field_0._1_7_ = gtest_ar_._1_7_;
    c1.field_0._0_1_ = gtest_ar_.success_;
    c1.field_0._8_8_ =
         gtest_ar_.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    c1._16_8_ = local_130.size_;
  }
  testing::
  Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::
  Action<std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>,void>
            ((Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)&gtest_ar,
             (function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)&c1);
  testing::internal::
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::WillOnce(pTVar1,(Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                     *)&gtest_ar);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  std::_Function_base::~_Function_base((_Function_base *)&c1);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&local_188);
  std::
  _Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
                  *)((long)&br.refill_.super__Function_base._M_functor + 8));
  testing::internal::MatcherBase<const_pstore::gsl::span<unsigned_char,_-1L>_&>::~MatcherBase
            ((MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&> *)&char1);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_1c0);
  refiller::refill_function(&r);
  pstore::http::
  make_buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
            (&br,(http *)&local_108,
             (function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)0x1000,(size_t)p_Stack_128);
  std::_Function_base::~_Function_base(&local_108);
  pstore::http::
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
  ::getc((buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
          *)&c1,(FILE *)&br);
  gtest_ar_.success_ = (bool)(c1.has_error_ ^ 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (c1.has_error_ == false) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pstore::error_or<std::tuple<int,pstore::maybe<char,void>>>::
    value_storage_impl<pstore::error_or<std::tuple<int,pstore::maybe<char,void>>>const&,std::tuple<int,pstore::maybe<char,void>>const>
              (&c1);
    pmVar3 = (maybe<char,_void> *)
             pstore::error_or<std::tuple<int,pstore::maybe<char,void>>>::
             value_storage_impl<pstore::error_or<std::tuple<int,pstore::maybe<char,void>>>const&,std::tuple<int,pstore::maybe<char,void>>const>
                       (&c1);
    pstore::maybe<char,_void>::maybe(&char1,pmVar3);
    cVar4 = char1.valid_;
    this_00 = &gtest_ar_.message_;
    gtest_ar_.success_ = char1.valid_;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (char1.valid_ == false) {
      testing::Message::Message((Message *)&local_188);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"char1.has_value ()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                 ,0x47,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_188);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((undefined **)local_188._M_dataplus._M_p != (undefined **)0x0) {
        (**(code **)(*(undefined **)local_188._M_dataplus._M_p + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      pcVar2 = pstore::maybe<char,void>::value_impl<pstore::maybe<char,void>const&,char_const>
                         (&char1);
      gtest_ar_.success_ = true;
      testing::internal::CmpHelperEQ<char,char>
                ((internal *)&gtest_ar,"char1.value ()","\'a\'",pcVar2,&gtest_ar_.success_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_188,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                   ,0x48,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&gtest_ar_)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
        if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
        }
      }
      this_00 = &gtest_ar.message_;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
  }
  else {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"static_cast<bool> (c1)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
               ,0x44,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((undefined **)local_188._M_dataplus._M_p != (undefined **)0x0) {
      (**(code **)(*(undefined **)local_188._M_dataplus._M_p + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    cVar4 = '\0';
  }
  pstore::error_or<std::tuple<int,_pstore::maybe<char,_void>_>_>::~error_or(&c1);
  if (cVar4 == '\0') goto LAB_0011a0fb;
  pstore::http::
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
  ::getc((buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
          *)&c1,(FILE *)&br);
  gtest_ar_.success_ = (bool)(c1.has_error_ ^ 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (c1.has_error_ == false) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pmVar3 = (maybe<char,_void> *)
             pstore::error_or<std::tuple<int,pstore::maybe<char,void>>>::
             value_storage_impl<pstore::error_or<std::tuple<int,pstore::maybe<char,void>>>const&,std::tuple<int,pstore::maybe<char,void>>const>
                       (&c1);
    pstore::maybe<char,_void>::maybe(&char1,pmVar3);
    gtest_ar_.success_ = (bool)(char1.valid_ ^ 1);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (char1.valid_ == true) {
      testing::Message::Message((Message *)&local_188);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"char2.has_value ()",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                 ,0x50,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_188);
      goto LAB_0011a0c5;
    }
  }
  else {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"static_cast<bool> (c2)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
               ,0x4c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_188);
LAB_0011a0c5:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((undefined **)local_188._M_dataplus._M_p != (undefined **)0x0) {
      (**(code **)(*(undefined **)local_188._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pstore::error_or<std::tuple<int,_pstore::maybe<char,_void>_>_>::~error_or(&c1);
LAB_0011a0fb:
  pstore::http::
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
  ::~buffered_reader(&br);
  refiller::~refiller(&r);
  return;
}

Assistant:

TEST (HttpdBufferedReader, GetcThenEOF) {
    refiller r;
    EXPECT_CALL (r, fill (_, _)).WillRepeatedly (Invoke (eof ()));
    EXPECT_CALL (r, fill (0, _)).WillOnce (Invoke (yield_string ("a")));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function ());
    {
        getc_result_type const c1 = br.getc (io);
        ASSERT_TRUE (static_cast<bool> (c1));
        io = std::get<0> (*c1);
        maybe<char> const char1 = std::get<1> (*c1);
        ASSERT_TRUE (char1.has_value ());
        EXPECT_EQ (char1.value (), 'a');
    }
    {
        getc_result_type const c2 = br.getc (io);
        ASSERT_TRUE (static_cast<bool> (c2));
        // Uncomment the next line if adding further blocks to this test!
        // io = std::get<0> (*c2);
        maybe<char> const char2 = std::get<1> (*c2);
        ASSERT_FALSE (char2.has_value ());
    }
}